

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<QOpenGLProgramBinaryCache::ShaderDesc>::moveAppend
          (QGenericArrayOps<QOpenGLProgramBinaryCache::ShaderDesc> *this,ShaderDesc *b,ShaderDesc *e
          )

{
  ShaderDesc *pSVar1;
  Data *pDVar2;
  char *pcVar3;
  qsizetype qVar4;
  qsizetype qVar5;
  
  if ((b != e) && (b < e)) {
    pSVar1 = (this->super_QArrayDataPointer<QOpenGLProgramBinaryCache::ShaderDesc>).ptr;
    qVar5 = (this->super_QArrayDataPointer<QOpenGLProgramBinaryCache::ShaderDesc>).size;
    do {
      pSVar1[qVar5].stage = b->stage;
      pDVar2 = (b->source).d.d;
      (b->source).d.d = (Data *)0x0;
      pSVar1[qVar5].source.d.d = pDVar2;
      pcVar3 = (b->source).d.ptr;
      (b->source).d.ptr = (char *)0x0;
      pSVar1[qVar5].source.d.ptr = pcVar3;
      qVar4 = (b->source).d.size;
      (b->source).d.size = 0;
      pSVar1[qVar5].source.d.size = qVar4;
      b = b + 1;
      qVar5 = (this->super_QArrayDataPointer<QOpenGLProgramBinaryCache::ShaderDesc>).size + 1;
      (this->super_QArrayDataPointer<QOpenGLProgramBinaryCache::ShaderDesc>).size = qVar5;
    } while (b < e);
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }